

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv.c
# Opt level: O2

conv_object conv_init(int N,int L)

{
  int N_00;
  conv_object pcVar1;
  fft_real_object pfVar2;
  
  pcVar1 = (conv_object)malloc(0x20);
  N_00 = findnexte(N + L + -1);
  pcVar1->clen = N_00;
  pcVar1->ilen1 = N;
  pcVar1->ilen2 = L;
  pfVar2 = fft_real_init(N_00,1);
  pcVar1->fobj = pfVar2;
  pfVar2 = fft_real_init(N_00,-1);
  pcVar1->iobj = pfVar2;
  return pcVar1;
}

Assistant:

conv_object conv_init(int N, int L) {
	
	conv_object obj = NULL;
	int conv_len;
	conv_len = N + L - 1;
		
	obj = (conv_object) malloc (sizeof(struct conv_set));
	 
	//obj->clen = npow2(conv_len);
	//obj->clen = conv_len;
	obj->clen = findnexte(conv_len);
	obj->ilen1 = N;
	obj->ilen2 = L;
	
	obj->fobj = fft_real_init(obj->clen,1);
	obj->iobj = fft_real_init(obj->clen,-1);
	
	return obj;
	
}